

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[17],char_const*,char[57],Diligent::IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>,char[73]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [17],char **RestArgs,char (*RestArgs_1) [57],
               IndexWrapper<unsigned_char,_Diligent::_DeviceContextIndexTag> *RestArgs_2,
               char (*RestArgs_3) [73])

{
  std::operator<<((ostream *)(ss + 0x10),*FirstArg);
  FormatStrSS<std::__cxx11::stringstream,char_const*,char[57],Diligent::IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>,char[73]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}